

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_title_screen.hpp
# Opt level: O3

void __thiscall PatchTitleScreen::inject_data(PatchTitleScreen *this,ROM *rom,World *world)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32_t uVar2;
  string local_38;
  
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
  uVar2 = md::ROM::inject_bytes(rom,TITLE1_TILES,0x741,&local_38);
  this->_title1_tiles_addr = uVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
  uVar2 = md::ROM::inject_bytes(rom,"%\x0e\x02\x05",0x6b,&local_38);
  this->_title1_layout_addr = uVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
  uVar2 = md::ROM::inject_bytes(rom,TITLE2_TILES,0x19b8,&local_38);
  this->_title2_tiles_addr = uVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
  uVar2 = md::ROM::inject_bytes(rom,"&\x10\x02_",0x54,&local_38);
  this->_title2_layout_addr = uVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
  uVar2 = md::ROM::inject_bytes(rom,TITLE3_TILES,0x2463,&local_38);
  this->_title3_tiles_addr = uVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
  uVar2 = md::ROM::inject_bytes(rom,TITLE3_LAYOUT,100,&local_38);
  this->_title3_layout_addr = uVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void inject_data(md::ROM& rom, World& world) override
    {
        _title1_tiles_addr = rom.inject_bytes(TITLE1_TILES, TITLE1_TILES_SIZE);
        _title1_layout_addr = rom.inject_bytes(TITLE1_LAYOUT, TITLE1_LAYOUT_SIZE);
        _title2_tiles_addr = rom.inject_bytes(TITLE2_TILES, TITLE2_TILES_SIZE);
        _title2_layout_addr = rom.inject_bytes(TITLE2_LAYOUT, TITLE2_LAYOUT_SIZE);
        _title3_tiles_addr = rom.inject_bytes(TITLE3_TILES, TITLE3_TILES_SIZE);
        _title3_layout_addr = rom.inject_bytes(TITLE3_LAYOUT, TITLE3_LAYOUT_SIZE);
    }